

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uamqp_messaging.c
# Opt level: O0

int add_fault_injection_properties
              (MESSAGE_HANDLE message_batch_container,char **property_keys,char **property_values,
              size_t property_count)

{
  int iVar1;
  AMQP_VALUE map;
  LOGGER_LOG p_Var2;
  AMQP_VALUE key;
  LOGGER_LOG l_4;
  LOGGER_LOG l_3;
  LOGGER_LOG l_2;
  LOGGER_LOG l_1;
  AMQP_VALUE map_value_value;
  AMQP_VALUE map_key_value;
  size_t i;
  LOGGER_LOG l;
  AMQP_VALUE uamqp_map;
  int result;
  size_t property_count_local;
  char **property_values_local;
  char **property_keys_local;
  MESSAGE_HANDLE message_batch_container_local;
  
  map = amqpvalue_create_map();
  if (map == (AMQP_VALUE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                ,"add_fault_injection_properties",0xe7,1,
                "Failed to create uAMQP map for the properties.");
    }
    uamqp_map._4_4_ = 0xe8;
  }
  else {
    uamqp_map._4_4_ = 0;
    for (map_key_value = (AMQP_VALUE)0x0; uamqp_map._4_4_ == 0 && map_key_value < property_count;
        map_key_value = (AMQP_VALUE)((long)&map_key_value->type + 1)) {
      l_1 = (LOGGER_LOG)0x0;
      key = amqpvalue_create_string(property_keys[(long)map_key_value]);
      if (key == (AMQP_VALUE)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"add_fault_injection_properties",0xf5,1,
                    "Failed to create uAMQP property key name.");
        }
        uamqp_map._4_4_ = 0xf6;
      }
      else {
        l_1 = (LOGGER_LOG)amqpvalue_create_string(property_values[(long)map_key_value]);
        if ((AMQP_VALUE)l_1 == (AMQP_VALUE)0x0) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                      ,"add_fault_injection_properties",0xfa,1,
                      "Failed to create uAMQP property key value.");
          }
          uamqp_map._4_4_ = 0xfb;
        }
        else {
          iVar1 = amqpvalue_set_map_value(map,key,(AMQP_VALUE)l_1);
          if (iVar1 != 0) {
            p_Var2 = xlogging_get_log_function();
            if (p_Var2 != (LOGGER_LOG)0x0) {
              (*p_Var2)(AZ_LOG_ERROR,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                        ,"add_fault_injection_properties",0xff,1,
                        "Failed to set key/value into the the uAMQP property map.");
            }
            uamqp_map._4_4_ = 0x100;
          }
        }
      }
      if (key != (AMQP_VALUE)0x0) {
        amqpvalue_destroy(key);
      }
      if (l_1 != (LOGGER_LOG)0x0) {
        amqpvalue_destroy((AMQP_VALUE)l_1);
      }
    }
    if (uamqp_map._4_4_ == 0) {
      iVar1 = message_set_application_properties(message_batch_container,map);
      if (iVar1 == 0) {
        uamqp_map._4_4_ = 0;
      }
      else {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 != (LOGGER_LOG)0x0) {
          (*p_Var2)(AZ_LOG_ERROR,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/uamqp_messaging.c"
                    ,"add_fault_injection_properties",0x10e,1,
                    "Failed to transfer the message properties to the uAMQP message.");
        }
        uamqp_map._4_4_ = 0x10f;
      }
    }
    amqpvalue_destroy(map);
  }
  return uamqp_map._4_4_;
}

Assistant:

static int add_fault_injection_properties(MESSAGE_HANDLE message_batch_container, const char* const* property_keys, const char* const* property_values, size_t property_count)
{
    int result;
    AMQP_VALUE uamqp_map;

    if ((uamqp_map = amqpvalue_create_map()) == NULL)
    {
        LogError("Failed to create uAMQP map for the properties.");
        result = MU_FAILURE;
    }
    else
    {
        result = RESULT_OK;

        for (size_t i = 0; result == RESULT_OK && i < property_count; i++)
        {
            AMQP_VALUE map_key_value = NULL;
            AMQP_VALUE map_value_value = NULL;

            if ((map_key_value = amqpvalue_create_string(property_keys[i])) == NULL)
            {
                LogError("Failed to create uAMQP property key name.");
                result = MU_FAILURE;
            }
            else if ((map_value_value = amqpvalue_create_string(property_values[i])) == NULL)
            {
                LogError("Failed to create uAMQP property key value.");
                result = MU_FAILURE;
            }
            else if (amqpvalue_set_map_value(uamqp_map, map_key_value, map_value_value) != 0)
            {
                LogError("Failed to set key/value into the the uAMQP property map.");
                result = MU_FAILURE;
            }

            if (map_key_value != NULL)
                amqpvalue_destroy(map_key_value);

            if (map_value_value != NULL)
                amqpvalue_destroy(map_value_value);
        }

        if (result == RESULT_OK)
        {
            if (message_set_application_properties(message_batch_container, uamqp_map) != 0)
            {
                LogError("Failed to transfer the message properties to the uAMQP message.");
                result = MU_FAILURE;
            }
            else
            {
                result = RESULT_OK;
            }
        }
        amqpvalue_destroy(uamqp_map);
    }

    return result;
}